

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O1

void __thiscall
BackwardPass::TrackObjTypeSpecProperties(BackwardPass *this,PropertySymOpnd *opnd,BasicBlock *block)

{
  Type pJVar1;
  ThreadContextInfo *pTVar2;
  JitArenaAllocator *pJVar3;
  long lVar4;
  code *pcVar5;
  int iVar6;
  BasicBlock *pBVar7;
  PropertySymOpnd *this_00;
  BackwardPass *pBVar8;
  bool bVar9;
  BOOLEAN BVar10;
  uint16 uVar11;
  uint16 uVar12;
  PropertyId PVar13;
  PropertyId PVar14;
  uint uVar15;
  uint uVar16;
  undefined4 *puVar17;
  HashTable<ObjTypeGuardBucket,_Memory::ArenaAllocator> *pHVar18;
  ObjTypeSpecFldInfo *this_01;
  JITTimeFunctionBody *pJVar19;
  FunctionJITTimeInfo *pFVar20;
  EquivalentTypeSet *leftTypeSet;
  EquivalentTypeSet *rightTypeSet;
  JITTypeHolder JVar21;
  BVSparse<Memory::JitArenaAllocator> *pBVar22;
  StackSym *pSVar23;
  ObjTypeGuardBucket *pOVar24;
  PropertySym *this_02;
  undefined1 *puVar25;
  Type_conflict pBVar26;
  JITTypeHolder *this_03;
  ThreadContext *this_04;
  ulong uVar27;
  ulong uVar28;
  nullptr_t local_f8;
  char16 debugStringBuffer [42];
  JITTypeHolderBase<void> local_98;
  ulong local_90;
  Phases *local_88;
  char16 *local_80;
  PropertyRecord *local_78;
  BasicBlock *local_70;
  ObjTypeGuardBucket *local_68;
  Type_conflict local_60;
  BVSparse<Memory::JitArenaAllocator> *local_58;
  StackSym *local_50;
  char16 *local_48;
  PropertySymOpnd *local_40;
  BackwardPass *local_38;
  
  local_38 = this;
  if (this->tag != DeadStorePhase) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar17 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar17 = 1;
    bVar9 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x159a,"(tag == Js::DeadStorePhase)","tag == Js::DeadStorePhase");
    if (!bVar9) goto LAB_003ed23e;
    *puVar17 = 0;
  }
  bVar9 = IR::PropertySymOpnd::IsTypeCheckSeqCandidate(opnd);
  if (!bVar9) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar17 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar17 = 1;
    bVar9 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x159b,"(opnd->IsTypeCheckSeqCandidate())","opnd->IsTypeCheckSeqCandidate()"
                      );
    if (!bVar9) goto LAB_003ed23e;
    *puVar17 = 0;
  }
  bVar9 = IR::PropertySymOpnd::IsTypeCheckSeqParticipant(opnd);
  if (bVar9) {
    pHVar18 = block->stackSymToGuardedProperties;
    if (pHVar18 == (HashTable<ObjTypeGuardBucket,_Memory::ArenaAllocator> *)0x0) {
      pHVar18 = HashTable<ObjTypeGuardBucket,_Memory::ArenaAllocator>::New
                          (&local_38->tempAlloc->super_ArenaAllocator,8);
      block->stackSymToGuardedProperties = pHVar18;
    }
    local_70 = block;
    local_40 = opnd;
    local_50 = IR::PropertySymOpnd::GetObjectSym(opnd);
    local_68 = HashTable<ObjTypeGuardBucket,_Memory::ArenaAllocator>::FindOrInsertNew
                         (pHVar18,(local_50->super_Sym).m_id);
    pBVar8 = local_38;
    local_58 = local_68->guardedPropertyOps;
    if (local_58 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      local_58 = (BVSparse<Memory::JitArenaAllocator> *)
                 new<Memory::JitArenaAllocator>(0x20,local_38->tempAlloc,0x3f1274);
      pJVar1 = pBVar8->tempAlloc;
      local_58->head = (Type_conflict)0x0;
      local_58->lastFoundIndex = (Type_conflict)0x0;
      local_58->alloc = pJVar1;
      local_58->lastUsedNodePrevNextField = (Type)local_58;
      local_68->guardedPropertyOps = local_58;
    }
    pBVar26 = local_58->head;
    if (pBVar26 != (Type_conflict)0x0) {
      puVar17 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      local_88 = (Phases *)&DAT_015cd718;
      do {
        uVar28 = (pBVar26->data).word;
        local_60 = pBVar26;
        if (uVar28 != 0) {
          local_90 = (ulong)pBVar26->startIndex;
          uVar27 = 0;
          if (uVar28 != 0) {
            for (; (uVar28 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
            }
          }
          do {
            iVar6 = (int)local_90;
            BVUnitT<unsigned_long>::AssertRange((BVIndex)uVar27);
            this_01 = Func::GetGlobalObjTypeSpecFldInfo(local_38->func,iVar6 + (BVIndex)uVar27);
            if (this_01 == (ObjTypeSpecFldInfo *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar17 = 1;
              bVar9 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                                 ,0x15b8,"(existingFldInfo != nullptr)","existingFldInfo != nullptr"
                                );
              if (!bVar9) goto LAB_003ed23e;
              *puVar17 = 0;
            }
            PVar13 = ObjTypeSpecFldInfo::GetPropertyId(this_01);
            PVar14 = IR::PropertySymOpnd::GetPropertyId(local_40);
            pBVar8 = local_38;
            if (PVar13 == PVar14) {
              pJVar19 = JITTimeWorkItem::GetJITFunctionBody(local_38->func->m_workItem);
              uVar15 = JITTimeFunctionBody::GetSourceContextId(pJVar19);
              local_48 = (char16 *)CONCAT44(local_48._4_4_,uVar15);
              pFVar20 = JITTimeWorkItem::GetJITTimeInfo(pBVar8->func->m_workItem);
              uVar15 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar20);
              bVar9 = Js::Phases::IsEnabled(local_88,EquivObjTypeSpecPhase,(uint)local_48,uVar15);
              if ((((bVar9) && (bVar9 = ObjTypeSpecFldInfo::IsPoly(this_01), bVar9)) &&
                  (local_40->objTypeSpecFldInfo != (ObjTypeSpecFldInfo *)0x0)) &&
                 (bVar9 = ObjTypeSpecFldInfo::IsPoly(local_40->objTypeSpecFldInfo), bVar9)) {
                leftTypeSet = ObjTypeSpecFldInfo::GetEquivalentTypeSet(this_01);
                rightTypeSet = IR::PropertySymOpnd::GetEquivalentTypeSet(local_40);
                bVar9 = GlobOpt::AreTypeSetsIdentical(leftTypeSet,rightTypeSet);
                if (bVar9) {
                  uVar11 = ObjTypeSpecFldInfo::GetSlotIndex(this_01);
                  uVar12 = IR::PropertySymOpnd::GetSlotIndex(local_40);
                  if (uVar11 == uVar12) goto LAB_003ece2d;
                }
                pBVar8 = local_38;
                pJVar19 = JITTimeWorkItem::GetJITFunctionBody(local_38->func->m_workItem);
                local_48 = JITTimeFunctionBody::GetDisplayName(pJVar19);
                pFVar20 = JITTimeWorkItem::GetJITTimeInfo(pBVar8->func->m_workItem);
                local_80 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar20,(wchar (*) [42])&local_f8)
                ;
                this_00 = local_40;
                pTVar2 = pBVar8->func->m_threadContextInfo;
                this_04 = (ThreadContext *)pTVar2[-3].wellKnownHostTypeIds;
                if (pTVar2 == (ThreadContextInfo *)0x0) {
                  this_04 = (ThreadContext *)0x0;
                }
                PVar13 = IR::PropertySymOpnd::GetPropertyId(local_40);
                local_78 = ThreadContext::GetPropertyRecord(this_04,PVar13);
                local_78 = local_78 + 1;
                uVar16 = IR::PropertySymOpnd::GetPropertyId(this_00);
                uVar15 = IR::PropertySymOpnd::GetObjTypeSpecFldId(this_00);
                Output::Print(L"EquivObjTypeSpec: top function %s (%s): duplicate property clash on %s(#%d) on operation %u \n"
                              ,local_48,local_80,local_78,(ulong)uVar16,(ulong)uVar15);
                Output::Flush();
              }
            }
LAB_003ece2d:
            uVar28 = uVar28 & ~(1L << (uVar27 & 0x3f));
            lVar4 = 0;
            if (uVar28 != 0) {
              for (; (uVar28 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
              }
            }
            uVar27 = (ulong)(-(uint)(uVar28 == 0) | (uint)lVar4);
          } while (uVar28 != 0);
        }
        pBVar26 = local_60->next;
      } while (pBVar26 != (Type)0x0);
    }
    opnd = local_40;
    uVar15 = IR::PropertySymOpnd::GetObjTypeSpecFldId(local_40);
    pOVar24 = local_68;
    ObjTypeGuardBucket::AddToGuardedPropertyOps(local_68,uVar15);
    bVar9 = IR::PropertySymOpnd::NeedsMonoCheck(opnd);
    pBVar7 = local_70;
    if (bVar9) {
      if ((opnd->objTypeSpecFldInfo == (ObjTypeSpecFldInfo *)0x0) ||
         (bVar9 = ObjTypeSpecFldInfo::IsMono(opnd->objTypeSpecFldInfo), !bVar9)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar17 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar17 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x15df,"(opnd->IsMono())","opnd->IsMono()");
        if (!bVar9) goto LAB_003ed23e;
        *puVar17 = 0;
      }
      if (((opnd->field_12).field_0.field_5.typeCheckSeqFlags & 0x10) == 0) {
        JVar21 = IR::PropertySymOpnd::GetType(opnd);
      }
      else {
        JVar21 = IR::PropertySymOpnd::GetInitialType(opnd);
      }
      (pOVar24->monoGuardType).t = JVar21.t;
    }
    bVar9 = IR::PropertySymOpnd::NeedsPrimaryTypeCheck(opnd);
    if (bVar9) {
      if (opnd->guardedPropOps == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
        pJVar3 = local_38->func->m_alloc;
        pBVar22 = (BVSparse<Memory::JitArenaAllocator> *)
                  new<Memory::JitArenaAllocator>(0x20,pJVar3,0x3f1274);
        pBVar22->head = (Type_conflict)0x0;
        pBVar22->lastFoundIndex = (Type_conflict)0x0;
        pBVar22->alloc = pJVar3;
        pBVar22->lastUsedNodePrevNextField = (Type)pBVar22;
        opnd->guardedPropOps = pBVar22;
      }
      IR::PropertySymOpnd::AddGuardedPropOps(opnd,local_58);
      bVar9 = IR::Instr::HasTypeCheckBailOut(local_38->currentInstr);
      if (bVar9) {
        this_03 = &pOVar24->monoGuardType;
        local_f8 = (nullptr_t)0x0;
        bVar9 = JITTypeHolderBase<void>::operator!=(this_03,&local_f8);
        if (bVar9) {
          bVar9 = IR::Instr::HasEquivalentTypeCheckBailOut(local_38->currentInstr);
          if (bVar9) {
            bVar9 = IR::PropertySymOpnd::SetMonoGuardType(opnd,this_03->t);
            if (!bVar9) {
              Func::ClearObjTypeSpecFldInfo(local_38->currentInstr->m_func,opnd->m_inlineCacheIndex)
              ;
              puVar25 = (undefined1 *)__cxa_allocate_exception(1);
              *puVar25 = 0x11;
              __cxa_throw(puVar25,&Js::RejitException::typeinfo,0);
            }
            IR::Instr::ChangeEquivalentToMonoTypeCheckBailOut(local_38->currentInstr);
          }
          JITTypeHolderBase<void>::JITTypeHolderBase(&local_98,(JITType *)0x0);
          this_03->t = local_98.t;
          if (pBVar7->typeIDsWithFinalType != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
            BVSparse<Memory::JitArenaAllocator>::Clear
                      (pBVar7->typeIDsWithFinalType,(local_50->super_Sym).m_id);
          }
        }
        if (((opnd->field_12).field_0.field_5.typeCheckSeqFlags & 2) == 0) {
          pOVar24->guardedPropertyOps = (BVSparse<Memory::JitArenaAllocator> *)0x0;
          Memory::
          DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
                    (local_38->tempAlloc,local_58);
          HashTable<ObjTypeGuardBucket,_Memory::ArenaAllocator>::Clear
                    (pBVar7->stackSymToGuardedProperties,(local_50->super_Sym).m_id);
        }
      }
      pHVar18 = pBVar7->stackSymToGuardedProperties;
      pSVar23 = IR::PropertySymOpnd::GetObjectSym(opnd);
      pOVar24 = HashTable<ObjTypeGuardBucket,_Memory::ArenaAllocator>::Get
                          (pHVar18,(pSVar23->super_Sym).m_id);
      if ((pOVar24 != (ObjTypeGuardBucket *)0x0) &&
         (((opnd->field_12).field_0.field_5.typeCheckSeqFlags & 2) == 0)) {
        pBVar22 = pOVar24->guardedPropertyOps;
        do {
          pBVar22 = (BVSparse<Memory::JitArenaAllocator> *)pBVar22->head;
          if (pBVar22 == (BVSparse<Memory::JitArenaAllocator> *)0x0) goto LAB_003ed11d;
        } while (((Type *)&pBVar22->alloc)->word == 0);
        if (pBVar22 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar17 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar17 = 1;
          bVar9 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                             ,0x1619,
                             "(opnd->IsTypeAvailable() || objTypeGuardBucket == nullptr || objTypeGuardBucket->GetGuardedPropertyOps()->IsEmpty())"
                             ,
                             "opnd->IsTypeAvailable() || objTypeGuardBucket == nullptr || objTypeGuardBucket->GetGuardedPropertyOps()->IsEmpty()"
                            );
          if (!bVar9) goto LAB_003ed23e;
          *puVar17 = 0;
        }
      }
    }
  }
  else {
    bVar9 = IR::PropertySymOpnd::NeedsLocalTypeCheck(opnd);
    if (bVar9) {
      if (opnd->guardedPropOps == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
        pJVar3 = local_38->func->m_alloc;
        pBVar22 = (BVSparse<Memory::JitArenaAllocator> *)
                  new<Memory::JitArenaAllocator>(0x20,pJVar3,0x3f1274);
        pBVar22->head = (Type_conflict)0x0;
        pBVar22->lastFoundIndex = (Type_conflict)0x0;
        pBVar22->alloc = pJVar3;
        pBVar22->lastUsedNodePrevNextField = (Type)pBVar22;
        opnd->guardedPropOps = pBVar22;
      }
      uVar15 = IR::PropertySymOpnd::GetObjTypeSpecFldId(opnd);
      IR::PropertySymOpnd::SetGuardedPropOp(opnd,uVar15);
    }
  }
LAB_003ed11d:
  if ((opnd->field_0x61 & 1) == 0) {
    return;
  }
  if (opnd->objTypeSpecFldInfo == (ObjTypeSpecFldInfo *)0x0) {
    return;
  }
  bVar9 = IR::PropertySymOpnd::IsTypeCheckSeqParticipant(opnd);
  if (!bVar9) {
    return;
  }
  if (((opnd->field_12).field_0.field_5.typeCheckSeqFlags & 0x20) != 0) {
    return;
  }
  if ((opnd->objTypeSpecFldInfo != (ObjTypeSpecFldInfo *)0x0) &&
     (bVar9 = ObjTypeSpecFldInfo::IsLoadedFromProto(opnd->objTypeSpecFldInfo), bVar9)) {
    return;
  }
  this_02 = IR::PropertySymOpnd::GetPropertySym(opnd);
  pSVar23 = PropertySym::GetAuxSlotPtrSym(this_02);
  if (((ushort)opnd->field_12 & 4) == 0) {
    if (pSVar23 == (StackSym *)0x0) {
      bVar9 = false;
      goto LAB_003ed20c;
    }
    BVar10 = BVSparse<Memory::JitArenaAllocator>::TestAndClear
                       (local_38->currentBlock->upwardExposedUses,(pSVar23->super_Sym).m_id);
  }
  else {
    if (pSVar23 == (StackSym *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar17 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar17 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x162b,"(auxSlotPtrSym)","auxSlotPtrSym");
      if (!bVar9) {
LAB_003ed23e:
        pcVar5 = (code *)invalidInstructionException();
        (*pcVar5)();
      }
      *puVar17 = 0;
    }
    BVar10 = BVSparse<Memory::JitArenaAllocator>::TestAndSet
                       (local_38->currentBlock->upwardExposedUses,(pSVar23->super_Sym).m_id);
  }
  bVar9 = BVar10 != '\0';
LAB_003ed20c:
  if ((bVar9) && (local_38->currentPrePassLoop == (Loop *)0x0)) {
    IR::PropertySymOpnd::SetProducesAuxSlotPtr(opnd,true);
  }
  return;
}

Assistant:

void
BackwardPass::TrackObjTypeSpecProperties(IR::PropertySymOpnd *opnd, BasicBlock *block)
{
    Assert(tag == Js::DeadStorePhase);
    Assert(opnd->IsTypeCheckSeqCandidate());

    // Now that we're in the dead store pass and we know definitively which operations will have a type
    // check and which are protected by an upstream type check, we can push the lists of guarded properties
    // up the flow graph and drop them on the type checks for the corresponding object symbol.
    if (opnd->IsTypeCheckSeqParticipant())
    {
        // Add this operation to the list of guarded operations for this object symbol.
        HashTable<ObjTypeGuardBucket>* stackSymToGuardedProperties = block->stackSymToGuardedProperties;
        if (stackSymToGuardedProperties == nullptr)
        {
            stackSymToGuardedProperties = HashTable<ObjTypeGuardBucket>::New(this->tempAlloc, 8);
            block->stackSymToGuardedProperties = stackSymToGuardedProperties;
        }

        StackSym* objSym = opnd->GetObjectSym();
        ObjTypeGuardBucket* bucket = stackSymToGuardedProperties->FindOrInsertNew(objSym->m_id);
        BVSparse<JitArenaAllocator>* guardedPropertyOps = bucket->GetGuardedPropertyOps();
        if (guardedPropertyOps == nullptr)
        {
            // The bit vectors we push around the flow graph only need to live as long as this phase.
            guardedPropertyOps = JitAnew(this->tempAlloc, BVSparse<JitArenaAllocator>, this->tempAlloc);
            bucket->SetGuardedPropertyOps(guardedPropertyOps);
        }

#if DBG
        FOREACH_BITSET_IN_SPARSEBV(propOpId, guardedPropertyOps)
        {
            ObjTypeSpecFldInfo* existingFldInfo = this->func->GetGlobalObjTypeSpecFldInfo(propOpId);
            Assert(existingFldInfo != nullptr);

            if (existingFldInfo->GetPropertyId() != opnd->GetPropertyId())
            {
                continue;
            }
            // It would be very nice to assert that the info we have for this property matches all properties guarded thus far.
            // Unfortunately, in some cases of object pointer copy propagation into a loop, we may end up with conflicting
            // information for the same property. We simply ignore the conflict and emit an equivalent type check, which
            // will attempt to check for one property on two different slots, and obviously fail. Thus we may have a
            // guaranteed bailout, but we'll simply re-JIT with equivalent object type spec disabled. To avoid this
            // issue altogether, we would need to track the set of guarded properties along with the type value in the
            // forward pass, and when a conflict is detected either not optimize the offending instruction, or correct
            // its information based on the info from the property in the type value info.
            //Assert(!existingFldInfo->IsPoly() || !opnd->IsPoly() || GlobOpt::AreTypeSetsIdentical(existingFldInfo->GetEquivalentTypeSet(), opnd->GetEquivalentTypeSet()));
            //Assert(existingFldInfo->GetSlotIndex() == opnd->GetSlotIndex());

            if (PHASE_TRACE(Js::EquivObjTypeSpecPhase, this->func) && !JITManager::GetJITManager()->IsJITServer())
            {
                if (existingFldInfo->IsPoly() && opnd->IsPoly() &&
                    (!GlobOpt::AreTypeSetsIdentical(existingFldInfo->GetEquivalentTypeSet(), opnd->GetEquivalentTypeSet()) ||
                    (existingFldInfo->GetSlotIndex() != opnd->GetSlotIndex())))
                {
                    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];

                    Output::Print(_u("EquivObjTypeSpec: top function %s (%s): duplicate property clash on %s(#%d) on operation %u \n"),
                        this->func->GetJITFunctionBody()->GetDisplayName(), this->func->GetDebugNumberSet(debugStringBuffer),
                        this->func->GetInProcThreadContext()->GetPropertyRecord(opnd->GetPropertyId())->GetBuffer(), opnd->GetPropertyId(), opnd->GetObjTypeSpecFldId());
                    Output::Flush();
                }
            }
        }
        NEXT_BITSET_IN_SPARSEBV
#endif

        bucket->AddToGuardedPropertyOps(opnd->GetObjTypeSpecFldId());

        if (opnd->NeedsMonoCheck())
        {
            Assert(opnd->IsMono());
            JITTypeHolder monoGuardType = opnd->IsInitialTypeChecked() ? opnd->GetInitialType() : opnd->GetType();
            bucket->SetMonoGuardType(monoGuardType);
        }

        if (opnd->NeedsPrimaryTypeCheck())
        {
            // Grab the guarded properties which match this type check with respect to polymorphism and drop them
            // on the operand. Only equivalent type checks can protect polymorphic properties to avoid a case where
            // we have 1) a cache with type set {t1, t2} and property a, followed by 2) a cache with type t3 and
            // property b, and 3) a cache with type set {t1, t2} and property c, where the slot index of property c
            // on t1 and t2 is different than on t3. If cache 2 were to protect property c it would not verify that
            // it resides on the correct slot for cache 3.  Yes, an equivalent type check could protect monomorphic
            // properties, but it would then unnecessarily verify their equivalence on the slow path.

            // Also, make sure the guarded properties on the operand are allocated from the func's allocator to
            // persists until lowering.

            Assert(guardedPropertyOps != nullptr);
            opnd->EnsureGuardedPropOps(this->func->m_alloc);
            opnd->AddGuardedPropOps(guardedPropertyOps);
            if (this->currentInstr->HasTypeCheckBailOut())
            {
                // Stop pushing the mono guard type up if it is being checked here.
                if (bucket->NeedsMonoCheck())
                {
                    if (this->currentInstr->HasEquivalentTypeCheckBailOut())
                    {
                        // Some instr protected by this one requires a monomorphic type check. (E.g., final type opt,
                        // fixed field not loaded from prototype.) Note the IsTypeAvailable test above: only do this at
                        // the initial type check that protects this path.
                        if (!opnd->SetMonoGuardType(bucket->GetMonoGuardType()))
                        {
                            // We can't safely check for the required type here. Clear the objtypespec info to disable optimization
                            // using this inline cache, since there appears to be a mismatch, and re-jit.
                            // (Dead store pass is too late to generate the bailout points we need to use this type correctly.)
                            this->currentInstr->m_func->ClearObjTypeSpecFldInfo(opnd->m_inlineCacheIndex);
                            throw Js::RejitException(RejitReason::FailedEquivalentTypeCheck);
                        }
                        this->currentInstr->ChangeEquivalentToMonoTypeCheckBailOut();
                    }
                    bucket->SetMonoGuardType(nullptr);
                    this->ClearTypeIDWithFinalType(objSym->m_id, block);
                }

                if (!opnd->IsTypeAvailable())
                {
                    // Stop tracking the guarded properties if there's not another type check upstream.
                    bucket->SetGuardedPropertyOps(nullptr);
                    JitAdelete(this->tempAlloc, guardedPropertyOps);
                    block->stackSymToGuardedProperties->Clear(objSym->m_id);
                }
            }
#if DBG
            {
                // If there is no upstream type check that is live and could protect guarded properties, we better
                // not have any properties remaining.
                ObjTypeGuardBucket* objTypeGuardBucket = block->stackSymToGuardedProperties->Get(opnd->GetObjectSym()->m_id);
                Assert(opnd->IsTypeAvailable() || objTypeGuardBucket == nullptr || objTypeGuardBucket->GetGuardedPropertyOps()->IsEmpty());
            }
#endif
        }
    }
    else if (opnd->NeedsLocalTypeCheck())
    {
        opnd->EnsureGuardedPropOps(this->func->m_alloc);
        opnd->SetGuardedPropOp(opnd->GetObjTypeSpecFldId());
    }

    if (opnd->UsesAuxSlot() && opnd->IsTypeCheckSeqParticipant() && !opnd->HasTypeMismatch() && !opnd->IsLoadedFromProto())
    {
        bool auxSlotPtrUpwardExposed = false;
        StackSym *auxSlotPtrSym = opnd->GetAuxSlotPtrSym();
        if (opnd->IsAuxSlotPtrSymAvailable())
        {    
            // This is an upward-exposed use of the aux slot pointer.
            Assert(auxSlotPtrSym);
            auxSlotPtrUpwardExposed = this->currentBlock->upwardExposedUses->TestAndSet(auxSlotPtrSym->m_id);
        }
        else if (auxSlotPtrSym != nullptr)
        {
            // The aux slot pointer is not upward-exposed at this point.
            auxSlotPtrUpwardExposed = this->currentBlock->upwardExposedUses->TestAndClear(auxSlotPtrSym->m_id);
        }
        if (!this->IsPrePass() && auxSlotPtrUpwardExposed)
        {
            opnd->SetProducesAuxSlotPtr(true);
        }
    }
}